

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_cpp.cpp
# Opt level: O0

void __thiscall flatbuffers::cpp::CppGenerator::GenIncludeDependencies(CppGenerator *this)

{
  bool bVar1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_00;
  iterator __first;
  iterator __last;
  reference filepath;
  allocator<char> local_189;
  string local_188;
  string local_168;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_148;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_128;
  undefined1 local_108 [8];
  string basename;
  string name_without_ext;
  IncludedFile *included_file;
  iterator __end2;
  iterator __begin2;
  vector<flatbuffers::IncludedFile,_std::allocator<flatbuffers::IncludedFile>_> *__range2;
  undefined1 local_98 [8];
  vector<flatbuffers::IncludedFile,_std::allocator<flatbuffers::IncludedFile>_> included_files;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  reference local_30;
  string *native_included_file;
  const_iterator __end3;
  const_iterator __begin3;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range3;
  CppGenerator *this_local;
  
  if (((this->opts_).super_IDLOptions.generate_object_based_api & 1U) != 0) {
    this_00 = &((this->super_BaseGenerator).parser_)->native_included_files_;
    __end3 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::begin(this_00);
    native_included_file =
         (string *)
         std::
         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::end(this_00);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end3,(__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                       *)&native_included_file), bVar1) {
      local_30 = __gnu_cxx::
                 __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator*(&__end3);
      std::operator+(&local_70,"#include \"",local_30);
      std::operator+(&local_50,&local_70,"\"");
      CodeWriter::operator+=(&this->code_,&local_50);
      std::__cxx11::string::~string((string *)&local_50);
      std::__cxx11::string::~string((string *)&local_70);
      __gnu_cxx::
      __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator++(&__end3);
    }
  }
  Parser::GetIncludedFiles
            ((vector<flatbuffers::IncludedFile,_std::allocator<flatbuffers::IncludedFile>_> *)
             local_98,(this->super_BaseGenerator).parser_);
  __first = std::vector<flatbuffers::IncludedFile,_std::allocator<flatbuffers::IncludedFile>_>::
            begin((vector<flatbuffers::IncludedFile,_std::allocator<flatbuffers::IncludedFile>_> *)
                  local_98);
  __last = std::vector<flatbuffers::IncludedFile,_std::allocator<flatbuffers::IncludedFile>_>::end
                     ((vector<flatbuffers::IncludedFile,_std::allocator<flatbuffers::IncludedFile>_>
                       *)local_98);
  std::
  stable_sort<__gnu_cxx::__normal_iterator<flatbuffers::IncludedFile*,std::vector<flatbuffers::IncludedFile,std::allocator<flatbuffers::IncludedFile>>>>
            ((__normal_iterator<flatbuffers::IncludedFile_*,_std::vector<flatbuffers::IncludedFile,_std::allocator<flatbuffers::IncludedFile>_>_>
              )__first._M_current,
             (__normal_iterator<flatbuffers::IncludedFile_*,_std::vector<flatbuffers::IncludedFile,_std::allocator<flatbuffers::IncludedFile>_>_>
              )__last._M_current);
  __end2 = std::vector<flatbuffers::IncludedFile,_std::allocator<flatbuffers::IncludedFile>_>::begin
                     ((vector<flatbuffers::IncludedFile,_std::allocator<flatbuffers::IncludedFile>_>
                       *)local_98);
  included_file =
       (IncludedFile *)
       std::vector<flatbuffers::IncludedFile,_std::allocator<flatbuffers::IncludedFile>_>::end
                 ((vector<flatbuffers::IncludedFile,_std::allocator<flatbuffers::IncludedFile>_> *)
                  local_98);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end2,(__normal_iterator<flatbuffers::IncludedFile_*,_std::vector<flatbuffers::IncludedFile,_std::allocator<flatbuffers::IncludedFile>_>_>
                                     *)&included_file), bVar1) {
    filepath = __gnu_cxx::
               __normal_iterator<flatbuffers::IncludedFile_*,_std::vector<flatbuffers::IncludedFile,_std::allocator<flatbuffers::IncludedFile>_>_>
               ::operator*(&__end2);
    StripExtension((string *)((long)&basename.field_2 + 8),&filepath->schema_name);
    if (((this->opts_).super_IDLOptions.keep_prefix & 1U) == 0) {
      StripPath((string *)local_108,(string *)((long)&basename.field_2 + 8));
    }
    else {
      std::__cxx11::string::string
                ((string *)local_108,(string *)(basename.field_2._M_local_buf + 8));
    }
    BaseGenerator::GeneratedFileName
              (&local_168,&this->super_BaseGenerator,&(this->opts_).super_IDLOptions.include_prefix,
               (string *)local_108,&(this->opts_).super_IDLOptions);
    std::operator+(&local_148,"#include \"",&local_168);
    std::operator+(&local_128,&local_148,"\"");
    CodeWriter::operator+=(&this->code_,&local_128);
    std::__cxx11::string::~string((string *)&local_128);
    std::__cxx11::string::~string((string *)&local_148);
    std::__cxx11::string::~string((string *)&local_168);
    std::__cxx11::string::~string((string *)local_108);
    std::__cxx11::string::~string((string *)(basename.field_2._M_local_buf + 8));
    __gnu_cxx::
    __normal_iterator<flatbuffers::IncludedFile_*,_std::vector<flatbuffers::IncludedFile,_std::allocator<flatbuffers::IncludedFile>_>_>
    ::operator++(&__end2);
  }
  bVar1 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::empty(&((this->super_BaseGenerator).parser_)->native_included_files_);
  if ((!bVar1) ||
     (bVar1 = std::vector<flatbuffers::IncludedFile,_std::allocator<flatbuffers::IncludedFile>_>::
              empty((vector<flatbuffers::IncludedFile,_std::allocator<flatbuffers::IncludedFile>_> *
                    )local_98), !bVar1)) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_188,"",&local_189);
    CodeWriter::operator+=(&this->code_,&local_188);
    std::__cxx11::string::~string((string *)&local_188);
    std::allocator<char>::~allocator(&local_189);
  }
  std::vector<flatbuffers::IncludedFile,_std::allocator<flatbuffers::IncludedFile>_>::~vector
            ((vector<flatbuffers::IncludedFile,_std::allocator<flatbuffers::IncludedFile>_> *)
             local_98);
  return;
}

Assistant:

void GenIncludeDependencies() {
    if (opts_.generate_object_based_api) {
      for (const std::string &native_included_file :
           parser_.native_included_files_) {
        code_ += "#include \"" + native_included_file + "\"";
      }
    }

    // Get the directly included file of the file being parsed.
    std::vector<IncludedFile> included_files(parser_.GetIncludedFiles());

    // We are safe to sort them alphabetically, since there shouldn't be any
    // interdependence between them.
    std::stable_sort(included_files.begin(), included_files.end());

    for (const IncludedFile &included_file : included_files) {
      // Get the name of the included file as defined by the schema, and strip
      // the .fbs extension.
      const std::string name_without_ext =
          StripExtension(included_file.schema_name);

      // If we are told to keep the prefix of the included schema, leave it
      // unchanged, otherwise strip the leading path off so just the "basename"
      // of the include is retained.
      const std::string basename =
          opts_.keep_prefix ? name_without_ext : StripPath(name_without_ext);

      code_ += "#include \"" +
               GeneratedFileName(opts_.include_prefix, basename, opts_) + "\"";
    }

    if (!parser_.native_included_files_.empty() || !included_files.empty()) {
      code_ += "";
    }
  }